

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void h2v2_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  int iVar1;
  long in_RCX;
  JSAMPARRAY in_RDX;
  long in_RSI;
  long in_RDI;
  int bias;
  JSAMPROW outptr;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JDIMENSION output_cols;
  JDIMENSION outcol;
  int outrow;
  int inrow;
  uint local_4c;
  undefined1 *local_48;
  byte *local_40;
  byte *local_38;
  uint local_2c;
  int local_28;
  int local_24;
  
  iVar1 = *(int *)(in_RSI + 0x1c);
  expand_right_edge(in_RDX,*(int *)(in_RDI + 0x13c),*(JDIMENSION *)(in_RDI + 0x30),iVar1 << 4);
  local_24 = 0;
  for (local_28 = 0; local_28 < *(int *)(in_RSI + 0xc); local_28 = local_28 + 1) {
    local_38 = in_RDX[local_24];
    local_40 = in_RDX[local_24 + 1];
    local_4c = 1;
    local_48 = *(undefined1 **)(in_RCX + (long)local_28 * 8);
    for (local_2c = 0; local_2c < (uint)(iVar1 << 3); local_2c = local_2c + 1) {
      *local_48 = (char)((int)((uint)*local_38 + (uint)local_38[1] + (uint)*local_40 +
                               (uint)local_40[1] + local_4c) >> 2);
      local_4c = local_4c ^ 3;
      local_38 = local_38 + 2;
      local_40 = local_40 + 2;
      local_48 = local_48 + 1;
    }
    local_24 = local_24 + 2;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  register JSAMPROW inptr0, inptr1, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor, cinfo->image_width,
                    output_cols * 2);

  inrow = 0;
  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    inptr0 = input_data[inrow];
    inptr1 = input_data[inrow + 1];
    bias = 1;                   /* bias = 1,2,1,2,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ =
        (JSAMPLE)((inptr0[0] + inptr0[1] + inptr1[0] + inptr1[1] + bias) >> 2);
      bias ^= 3;                /* 1=>2, 2=>1 */
      inptr0 += 2;  inptr1 += 2;
    }
    inrow += 2;
  }
}